

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NAttrsCompare(void *data1,void *data2)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (data1 == data2) {
    iVar5 = 0;
  }
  else {
    iVar3 = -1;
    iVar5 = iVar3;
    if ((data1 != (void *)0x0) && (iVar4 = 1, iVar5 = iVar4, data2 != (void *)0x0)) {
      lVar1 = *(long *)((long)data1 + 0x48);
      lVar2 = *(long *)((long)data2 + 0x48);
      if ((lVar1 == lVar2) ||
         ((((iVar5 = iVar3, lVar1 != 0 && (iVar5 = iVar4, lVar2 != 0)) &&
           (iVar5 = iVar3, *(long *)(lVar1 + 0x18) != 0)) &&
          ((iVar5 = iVar4, *(long *)(lVar2 + 0x18) != 0 &&
           (iVar5 = xmlStrcmp(*(xmlChar **)(lVar1 + 0x10),*(xmlChar **)(lVar2 + 0x10)), iVar5 == 0))
          )))) {
        iVar5 = xmlStrcmp(*(xmlChar **)((long)data1 + 0x10),*(xmlChar **)((long)data2 + 0x10));
        return iVar5;
      }
    }
  }
  return iVar5;
}

Assistant:

static int
xmlC14NAttrsCompare(const void *data1, const void *data2)
{
    const xmlAttr *attr1 = data1;
    const xmlAttr *attr2 = data2;
    int ret = 0;

    /*
     * Simple cases
     */
    if (attr1 == attr2)
        return (0);
    if (attr1 == NULL)
        return (-1);
    if (attr2 == NULL)
        return (1);
    if (attr1->ns == attr2->ns) {
        return (xmlStrcmp(attr1->name, attr2->name));
    }

    /*
     * Attributes in the default namespace are first
     * because the default namespace is not applied to
     * unqualified attributes
     */
    if (attr1->ns == NULL)
        return (-1);
    if (attr2->ns == NULL)
        return (1);
    if (attr1->ns->prefix == NULL)
        return (-1);
    if (attr2->ns->prefix == NULL)
        return (1);

    ret = xmlStrcmp(attr1->ns->href, attr2->ns->href);
    if (ret == 0) {
        ret = xmlStrcmp(attr1->name, attr2->name);
    }
    return (ret);
}